

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_25::BinaryReader::ReadMemorySection(BinaryReader *this,Offset section_size)

{
  Index IVar1;
  int iVar2;
  Result RVar3;
  char *format;
  uint uVar4;
  Index num_memories;
  Limits page_limits;
  uint local_4c;
  Limits local_48;
  
  iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x20])();
  if (iVar2 == 0) {
    RVar3 = ReadCount(this,&local_4c,"memory count");
    if (RVar3.enum_ != Error) {
      iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x21])(this->delegate_,(ulong)local_4c);
      if (iVar2 == 0) {
        if (local_4c != 0) {
          uVar4 = 0;
          do {
            IVar1 = this->num_memory_imports_;
            local_48.initial = 0;
            local_48.max._0_7_ = 0;
            local_48._15_4_ = 0;
            RVar3 = ReadMemory(this,&local_48);
            if (RVar3.enum_ == Error) {
              return (Result)Error;
            }
            iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x22])
                              (this->delegate_,(ulong)(IVar1 + uVar4),&local_48);
            if (iVar2 != 0) {
              format = "OnMemory callback failed";
              goto LAB_001260ce;
            }
            uVar4 = uVar4 + 1;
          } while (local_4c != uVar4);
        }
        iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x23])();
        if (iVar2 == 0) {
          return (Result)Ok;
        }
        format = "EndMemorySection callback failed";
      }
      else {
        format = "OnMemoryCount callback failed";
      }
LAB_001260ce:
      PrintError(this,format);
    }
  }
  else {
    PrintError(this,"BeginMemorySection callback failed");
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadMemorySection(Offset section_size) {
  CALLBACK(BeginMemorySection, section_size);
  Index num_memories;
  CHECK_RESULT(ReadCount(&num_memories, "memory count"));
  CALLBACK(OnMemoryCount, num_memories);
  for (Index i = 0; i < num_memories; ++i) {
    Index memory_index = num_memory_imports_ + i;
    Limits page_limits;
    CHECK_RESULT(ReadMemory(&page_limits));
    CALLBACK(OnMemory, memory_index, &page_limits);
  }
  CALLBACK0(EndMemorySection);
  return Result::Ok;
}